

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O3

void __thiscall
CTextRender::TextDeferred(CTextRender *this,CTextCursor *pCursor,char *pText,int Length)

{
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *this_00;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  IGraphics *pIVar5;
  CScaledGlyph *pCVar6;
  vec2 ScreenScale;
  vec2 ScreenScale_00;
  float fVar7;
  long lVar8;
  uint i;
  long lVar9;
  CScaledGlyph *pCVar10;
  uint FontSizeIndex;
  int iVar11;
  int *piVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  byte *pText_00;
  int NumDots;
  int iVar16;
  uint uVar17;
  long in_FS_OFFSET;
  uint uVar18;
  float fVar19;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar20;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar21;
  float fVar22;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar23;
  float fVar24;
  CWordWidthHint CVar25;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  char aEllipsis [4];
  float local_4c;
  undefined1 local_48 [4];
  float local_44;
  undefined1 local_40 [4];
  char local_3c [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((pCursor->m_Truncated == false) && (pCursor->m_SkipTextRender == false)) &&
     (this->m_pGlyphMap->m_DefaultFace != (FT_Face_conflict)0x0)) {
    uVar17 = pCursor->m_Flags;
    pIVar5 = this->m_pGraphics;
    iVar14 = pIVar5->m_ScreenHeight;
    (*(pIVar5->super_IInterface)._vptr_IInterface[6])(pIVar5,local_40,&local_44,local_48,&local_4c);
    aVar23.x = (float)iVar14 / (local_4c - local_44);
    fVar19 = pCursor->m_FontSize;
    iVar14 = (int)(fVar19 * aVar23.x);
    fVar22 = (float)(int)(fVar19 * aVar23.x) / aVar23.x;
    piVar12 = s_aFontSizes;
    lVar9 = 0;
    do {
      if (iVar14 <= *piVar12) goto LAB_00131493;
      lVar9 = lVar9 + 1;
      piVar12 = piVar12 + 1;
    } while (lVar9 != 0x10);
    lVar9 = 0x10;
LAB_00131493:
    FontSizeIndex = 0xf;
    if ((uint)lVar9 < 0xf) {
      FontSizeIndex = (uint)lVar9;
    }
    uVar3 = pCursor->m_Flags;
    uVar18 = -(uint)(pCursor->m_MaxWidth < 0.0);
    fVar7 = (float)(~uVar18 & (uint)pCursor->m_MaxWidth | uVar18 & 0x7f800000);
    iVar11 = (int)((local_4c - local_44) / fVar19);
    if (-1 < pCursor->m_MaxLines) {
      iVar11 = pCursor->m_MaxLines;
    }
    if (Length < 0) {
      Length = str_length(pText);
      fVar19 = pCursor->m_FontSize;
    }
    aVar21.y = 0.0;
    fVar19 = (float)(int)((fVar19 + (pCursor->m_Advance).field_1.y) * aVar23.x) / aVar23.x;
    if (fVar19 <= pCursor->m_NextLineAdvanceY) {
      fVar19 = pCursor->m_NextLineAdvanceY;
    }
    pCursor->m_NextLineAdvanceY = fVar19;
    pText_00 = (byte *)pText;
    if (0 < Length) {
      aVar20.x = aVar23.x;
      do {
        if (pCursor->m_Truncated != false) break;
        fVar19 = (pCursor->m_Advance).field_0.x;
        ScreenScale.field_1.y = aVar21.y;
        ScreenScale.field_0.x = aVar20.x;
        CVar25 = MakeWord(this,pCursor,(char *)pText_00,pText + Length,FontSizeIndex,fVar22,iVar14,
                          ScreenScale);
        pCursor->m_StartOfLine = false;
        if ((long)CVar25._0_8_ < 0) break;
        if (fVar7 < CVar25.m_EffectiveAdvanceX) {
          iVar4 = (pCursor->m_Glyphs).num_elements;
          lVar9 = (long)iVar4;
          iVar16 = CVar25.m_GlyphCount;
          if (((iVar16 == 1) && ((ulong)*pText_00 < 0x21)) &&
             ((0x100000600U >> ((ulong)*pText_00 & 0x3f) & 1) != 0)) {
            if ((uVar17 & 1) == 0) {
              array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::remove_index
                        (&pCursor->m_Glyphs,iVar4 + -1);
            }
            (pCursor->m_Advance).field_0.x = fVar19;
          }
          else if (pCursor->m_LineCount < iVar11) {
            pCursor->m_LineCount = pCursor->m_LineCount + 1;
            fVar2 = (pCursor->m_Advance).field_1.y;
            aVar1 = (anon_union_4_2_94730284_for_vector2_base<float>_1)pCursor->m_NextLineAdvanceY;
            fVar24 = pCursor->m_LineSpacing + aVar1.x;
            (pCursor->m_Advance).field_1.y = fVar24;
            (pCursor->m_Advance).field_0.x = (pCursor->m_Advance).field_0.x - fVar19;
            aVar20.x = (float)(int)((fVar24 + pCursor->m_FontSize) * aVar23.x) / aVar23.x;
            if (aVar20.x <= aVar1.x) {
              aVar20 = aVar1;
            }
            pCursor->m_NextLineAdvanceY = (float)aVar20;
            if (((uVar17 & 1) == 0) && (0 < iVar16)) {
              pCVar10 = (pCursor->m_Glyphs).list;
              lVar13 = lVar9 << 6;
              do {
                *(float *)((long)pCVar10 + lVar13 + -0x2c) =
                     *(float *)((long)pCVar10 + lVar13 + -0x2c) - fVar19;
                pCVar10 = (pCursor->m_Glyphs).list;
                aVar20.x = ((pCursor->m_Advance).field_1.y - fVar2) +
                           *(float *)((long)pCVar10 + lVar13 + -0x28);
                lVar9 = lVar9 + -1;
                ((anon_union_4_2_94730284_for_vector2_base<float>_1 *)
                ((long)pCVar10 + lVar13 + -0x28))->x = (float)aVar20;
                pCVar10 = (pCursor->m_Glyphs).list;
                *(int *)((long)pCVar10 + lVar13 + -0x30) = pCursor->m_LineCount + -1;
                lVar13 = lVar13 + -0x40;
              } while (iVar4 - iVar16 < lVar9);
            }
            aVar21.y = 0.0;
            pCursor->m_StartOfLine = false;
          }
          else {
            pCursor->m_Truncated = true;
          }
        }
        fVar19 = (pCursor->m_Advance).field_0.x;
        if (fVar19 <= pCursor->m_Width) {
          fVar19 = pCursor->m_Width;
        }
        pCursor->m_Width = fVar19;
        if ((CVar25._8_8_ >> 0x20 & 1) != 0 && (uVar3 & 2) != 0 || (CVar25._8_8_ >> 0x28 & 1) != 0)
        {
          if (pCursor->m_LineCount < iVar11) {
            pCursor->m_LineCount = pCursor->m_LineCount + 1;
            aVar1 = (anon_union_4_2_94730284_for_vector2_base<float>_1)pCursor->m_NextLineAdvanceY;
            fVar19 = pCursor->m_LineSpacing + aVar1.x;
            (pCursor->m_Advance).field_1.y = fVar19;
            (pCursor->m_Advance).field_0.x = 0.0;
            pCursor->m_StartOfLine = true;
            aVar21.y = 0.0;
            aVar20.x = (float)(int)((fVar19 + pCursor->m_FontSize) * aVar23.x) / aVar23.x;
            if (aVar20.x <= aVar1.x) {
              aVar20 = aVar1;
            }
            pCursor->m_NextLineAdvanceY = (float)aVar20;
          }
          else {
            pCursor->m_Truncated = true;
          }
        }
        pText_00 = pText_00 + (CVar25._0_8_ >> 0x20);
      } while (pText_00 < pText + Length);
      fVar19 = pCursor->m_NextLineAdvanceY;
    }
    fVar19 = fVar22 * 0.35 + fVar19;
    pCursor->m_Height = fVar19;
    pCursor->m_CharCount = (int)pText_00 - (int)pText;
    if ((pCursor->m_Truncated == true) && ((pCursor->m_Flags & 4) != 0)) {
      builtin_strncpy(local_3c,"…",4);
      lVar9 = (long)(pCursor->m_Glyphs).num_elements;
      if (0 < lVar9) {
        pCVar10 = (pCursor->m_Glyphs).list;
        (pCursor->m_Advance).field_0.x =
             (pCVar10[lVar9 + -1].m_pGlyph)->m_AdvanceX * pCVar10[lVar9 + -1].m_Size +
             pCVar10[lVar9 + -1].m_Advance.field_0.x;
        (pCursor->m_Advance).field_1 = pCVar10[lVar9 + -1].m_Advance.field_1;
      }
      fVar2 = pCursor->m_MaxWidth;
      pCursor->m_MaxWidth = -1.0;
      ScreenScale_00.field_1.y = 0.0;
      ScreenScale_00.field_0.x = fVar19;
      CVar25 = MakeWord(this,pCursor,local_3c,(char *)&local_38,FontSizeIndex,fVar22,iVar14,
                        ScreenScale_00);
      pCursor->m_MaxWidth = (float)(int)fVar2;
      if (fVar7 < CVar25.m_EffectiveAdvanceX) {
        iVar14 = (pCursor->m_Glyphs).num_elements;
        uVar17 = CVar25.m_GlyphCount;
        fVar19 = 0.0;
        if (1 < (int)(~uVar17 + iVar14)) {
          this_00 = &pCursor->m_Glyphs;
          uVar15 = (ulong)(~uVar17 + iVar14);
          pCVar10 = this_00->list;
          fVar22 = pCVar10[uVar15].m_Advance.field_0.x;
          if (fVar7 < (pCVar10[uVar15].m_pGlyph)->m_AdvanceX * pCVar10[uVar15].m_Size + fVar22) {
            pCVar10 = pCVar10 + uVar15;
            lVar9 = uVar15 * 0x40 + -0x2c;
            do {
              fVar2 = fVar22;
              fVar19 = (pCursor->m_Advance).field_0.x;
              pCursor->m_CharCount = pCursor->m_CharCount - pCVar10->m_NumChars;
              array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::remove_index
                        (this_00,(int)uVar15);
              if ((int)uVar15 < 3) break;
              uVar15 = uVar15 - 1;
              pCVar6 = this_00->list;
              pCVar10 = pCVar6 + uVar15;
              fVar22 = *(float *)((long)&pCVar6->m_pGlyph + lVar9);
              lVar13 = lVar9 + -0x14;
              lVar8 = lVar9 + -0xc;
              lVar9 = lVar9 + -0x40;
            } while (fVar7 < *(float *)(*(long *)((long)pCVar6 + lVar13) + 0x2c) *
                             *(float *)((long)pCVar6 + lVar8) + fVar22);
            fVar19 = fVar19 - fVar2;
          }
          iVar14 = (pCursor->m_Glyphs).num_elements;
        }
        if (0 < (int)uVar17) {
          lVar9 = (long)(int)(iVar14 - uVar17);
          uVar15 = lVar9 << 6 | 0x14;
          do {
            pCVar10 = (pCursor->m_Glyphs).list;
            *(float *)((long)&pCVar10->m_pGlyph + uVar15) =
                 *(float *)((long)&pCVar10->m_pGlyph + uVar15) - fVar19;
            lVar9 = lVar9 + 1;
            uVar15 = uVar15 + 0x40;
          } while (lVar9 < (pCursor->m_Glyphs).num_elements);
        }
      }
    }
    TextRefreshGlyphs(this,pCursor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTextRender::TextDeferred(CTextCursor *pCursor, const char *pText, int Length)
{
	if(pCursor->m_Truncated || pCursor->m_SkipTextRender)
		return;

	if(!m_pGlyphMap->GetDefaultFace())
		return;

	bool Render = !(pCursor->m_Flags & TEXTFLAG_NO_RENDER);

	// Alignment
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	int ScreenWidth = Graphics()->ScreenWidth();
	int ScreenHeight = Graphics()->ScreenHeight();
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	vec2 ScreenScale = vec2(ScreenWidth/(ScreenX1-ScreenX0), ScreenHeight/(ScreenY1-ScreenY0));
	float Size = pCursor->m_FontSize;
	int PixelSize = (int)(Size * ScreenScale.y);
	Size = PixelSize / ScreenScale.y;
	int FontSizeIndex = m_pGlyphMap->GetFontSizeIndex(PixelSize);

	// Cursor current states
	int Flags = pCursor->m_Flags;
	float MaxWidth = pCursor->m_MaxWidth;
	if(MaxWidth < 0)
		MaxWidth = INFINITY;
	int MaxLines = pCursor->m_MaxLines;
	if(MaxLines < 0)
		MaxLines = (ScreenY1-ScreenY0) / pCursor->m_FontSize;

	if(Length < 0)
		Length = str_length(pText);

	const char *pCur = (char *)pText;
	const char *pEnd = (char *)pText + Length;

	float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
	NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
	pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);

	while(pCur < pEnd && !pCursor->m_Truncated)
	{
		const float WordStartAdvanceX = pCursor->m_Advance.x;
		CWordWidthHint WordWidth = MakeWord(pCursor, pCur, pEnd, FontSizeIndex, Size, PixelSize, ScreenScale);
		pCursor->m_StartOfLine = false;
		if(WordWidth.m_CharCount < 0)
			break;
		
		// word wrapping
		if(WordWidth.m_EffectiveAdvanceX > MaxWidth)
		{
			const int NumGlyphs = pCursor->m_Glyphs.size();
			// do not let space create new line.
			if(WordWidth.m_GlyphCount == 1 && (*pCur == ' ' || *pCur == '\n' || *pCur == '\t'))
			{
				if(Render)
					pCursor->m_Glyphs.remove_index(NumGlyphs-1);
				pCursor->m_Advance.x = WordStartAdvanceX;
			}
			else
			{
				if(pCursor->m_LineCount < MaxLines)
				{
					pCursor->m_LineCount++;
					float AdvanceY = pCursor->m_Advance.y;
					pCursor->m_Advance.y = pCursor->m_LineSpacing + pCursor->m_NextLineAdvanceY;
					pCursor->m_Advance.x -= WordStartAdvanceX;

					float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
					NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
					pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);

					if(Render)
					{
						const int WordStartGlyphIndex = NumGlyphs - WordWidth.m_GlyphCount;
						for(int i = NumGlyphs - 1; i >= WordStartGlyphIndex; --i)
						{
							pCursor->m_Glyphs[i].m_Advance.x -= WordStartAdvanceX;
							pCursor->m_Glyphs[i].m_Advance.y += pCursor->m_Advance.y - AdvanceY;
							pCursor->m_Glyphs[i].m_Line = pCursor->m_LineCount - 1;
						}
					}

					pCursor->m_StartOfLine = false;
				}
				else
				{
					pCursor->m_Truncated = true;
				}
			}
		}

		pCursor->m_Width = maximum(pCursor->m_Advance.x, pCursor->m_Width);

		// newline \n
		bool ForceNewLine = WordWidth.m_EndsWithNewline && (Flags & TEXTFLAG_ALLOW_NEWLINE);
		if(ForceNewLine || WordWidth.m_IsBroken)
		{
			if(pCursor->m_LineCount < MaxLines)
			{
				pCursor->m_LineCount++;
				pCursor->m_Advance.y = pCursor->m_LineSpacing + pCursor->m_NextLineAdvanceY;
				pCursor->m_Advance.x = 0;
				pCursor->m_StartOfLine = true;

				float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
				NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
				pCursor->m_NextLineAdvanceY = maximum(NextAdvanceY, pCursor->m_NextLineAdvanceY);
			}
			else
			{
				pCursor->m_Truncated = true;
			}
		}

		pCur += WordWidth.m_CharCount;
	}

	pCursor->m_Height = pCursor->m_NextLineAdvanceY + 0.35f * Size;
	pCursor->m_CharCount = pCur - pText;

	// insert ellipsis at the end
	if(pCursor->m_Truncated && pCursor->m_Flags & TEXTFLAG_ELLIPSIS)
	{
		const char aEllipsis[] = "…";
		if(pCursor->m_Glyphs.size() > 0)
		{
			CScaledGlyph *pLastGlyph = &pCursor->m_Glyphs[pCursor->m_Glyphs.size()-1];
			pCursor->m_Advance.x = pLastGlyph->m_Advance.x + pLastGlyph->m_pGlyph->m_AdvanceX * pLastGlyph->m_Size;
			pCursor->m_Advance.y = pLastGlyph->m_Advance.y;
		}

		int OldMaxWidth = pCursor->m_MaxWidth;
		pCursor->m_MaxWidth = -1;
		CWordWidthHint WordWidth = MakeWord(pCursor, aEllipsis, aEllipsis+sizeof(aEllipsis), FontSizeIndex, Size, PixelSize, ScreenScale);
		pCursor->m_MaxWidth = OldMaxWidth;
		if(WordWidth.m_EffectiveAdvanceX > MaxWidth)
		{
			int NumDots = WordWidth.m_GlyphCount;
			int NumGlyphs = pCursor->m_Glyphs.size() - NumDots;
			float BackAdvanceX = 0;
			for(int i = NumGlyphs - 1; i > 1; --i)
			{
				CScaledGlyph *pScaled = &pCursor->m_Glyphs[i];
				if(pScaled->m_Advance.x + pScaled->m_pGlyph->m_AdvanceX * pScaled->m_Size > MaxWidth)
				{
					BackAdvanceX = pCursor->m_Advance.x - pScaled->m_Advance.x;
					pCursor->m_CharCount -= pScaled->m_NumChars;
					pCursor->m_Glyphs.remove_index(i);
				}
				else
					break;
			}
			for(int i = pCursor->m_Glyphs.size() - NumDots; i < pCursor->m_Glyphs.size(); ++i)
				pCursor->m_Glyphs[i].m_Advance.x -= BackAdvanceX;
		}
	}

	TextRefreshGlyphs(pCursor);
}